

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_Test2DLinearResource_Test::TestBody(CTestResource_Test2DLinearResource_Test *this)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  uint local_100;
  uint local_f8;
  uint32_t AlignedSize_1;
  uint32_t PitchInBytes_1;
  uint32_t AlignedHeight_1;
  uint32_t AlignedWidth_1;
  GMM_RESOURCE_INFO *ResourceInfo_1;
  uint32_t PitchAlignment_1;
  uint32_t MinPitch_1;
  TEST_BPP bpp_1;
  uint32_t i_1;
  uint32_t AlignedSize;
  uint32_t PitchInBytes;
  uint32_t AlignedHeight;
  uint32_t AlignedWidth;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint32_t PitchAlignment;
  uint32_t MinPitch;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t VAlign;
  uint32_t HAlign;
  CTestResource_Test2DLinearResource_Test *this_local;
  
  gmmParams.MultiTileArch.Reserved = 0x10;
  gmmParams.MultiTileArch._0_1_ = 4;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_32;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xfffffffffff7ffff | 0x80000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  for (MinPitch = 0; MinPitch < 5; MinPitch = MinPitch + 1) {
    i = CTestResource::SetResourceFormat(&this->super_CTestResource,MinPitch);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp);
    uVar3 = gmmParams.CpTag;
    iVar1 = (gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3);
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,MinPitch);
    local_f8 = ((uVar3 + 0xf) - (uVar3 + 0xf & 0xf)) * uVar2;
    if (local_f8 < 0x21) {
      local_f8 = 0x20;
    }
    uVar3 = (local_f8 + 0x3f) - (local_f8 + 0x3f & 0x3f);
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar4,uVar3);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar4,
               (ulong)((uVar3 * iVar1 + 0xfff) - (uVar3 * iVar1 + 0xfff & 0xfff)));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
  }
  for (MinPitch_1 = 0; MinPitch_1 < 5; MinPitch_1 = MinPitch_1 + 1) {
    i = CTestResource::SetResourceFormat(&this->super_CTestResource,MinPitch_1);
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 0x100;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp);
    uVar3 = gmmParams.CpTag;
    iVar1 = (gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3);
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,MinPitch_1);
    local_100 = ((uVar3 + 0xf) - (uVar3 + 0xf & 0xf)) * uVar2;
    if (local_100 < 0x21) {
      local_100 = 0x20;
    }
    uVar3 = (local_100 + 0x3f) - (local_100 + 0x3f & 0x3f);
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar4,uVar3);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar4,
               (ulong)((uVar3 * iVar1 + 0xfff) - (uVar3 * iVar1 + 0xfff & 0xfff)));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
  }
  return;
}

Assistant:

TEST_F(CTestResource, Test2DLinearResource)
{
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 256 x 256
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 256;
        gmmParams.BaseHeight  = 256;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}